

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

void __thiscall spirv_cross::SPIRType::SPIRType(SPIRType *this,Op op_)

{
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRType_004faf78;
  *(Op *)&(this->super_IVariant).field_0xc = op_;
  this->basetype = Unknown;
  this->width = 0;
  this->vecsize = 1;
  this->columns = 1;
  (this->array).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->array).super_VectorView<unsigned_int>.ptr = (uint *)&(this->array).stack_storage;
  (this->array).buffer_capacity = 8;
  (this->array_size_literal).super_VectorView<bool>.buffer_size = 0;
  (this->array_size_literal).super_VectorView<bool>.ptr =
       (bool *)&(this->array_size_literal).stack_storage;
  (this->array_size_literal).buffer_capacity = 8;
  this->pointer_depth = 0;
  this->pointer = false;
  this->forward_pointer = false;
  this->storage = Generic;
  (this->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
       0;
  (this->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&(this->member_types).stack_storage;
  (this->member_types).buffer_capacity = 8;
  (this->member_type_index_redirection).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->member_type_index_redirection).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->member_type_index_redirection).stack_storage;
  (this->member_type_index_redirection).buffer_capacity = 8;
  *(undefined4 *)((long)&(this->image).dim + 3) = 0;
  (this->image).type = 0;
  (this->image).dim = Dim1D;
  (this->parent_type).id = 0;
  (this->image).sampled = 0;
  (this->image).format = ImageFormatUnknown;
  *(undefined8 *)&(this->image).access = 0;
  (this->member_name_cache)._M_h._M_buckets = &(this->member_name_cache)._M_h._M_single_bucket;
  (this->member_name_cache)._M_h._M_bucket_count = 1;
  (this->member_name_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->member_name_cache)._M_h._M_element_count = 0;
  (this->member_name_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->member_name_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->member_name_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit SPIRType(spv::Op op_) : op(op_) {}